

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O1

Section * create_section(ObjectUnit *ou,char *name,uint8_t *data,unsigned_long size)

{
  uint32_t uVar1;
  Section *pSVar2;
  char *pcVar3;
  
  pSVar2 = (Section *)alloczero(0xa8);
  pcVar3 = "";
  if (name != (char *)0x0) {
    pcVar3 = name;
  }
  pSVar2->name = pcVar3;
  pSVar2->data = data;
  pSVar2->size = size;
  pSVar2->obj = ou;
  uVar1 = create_section::idcnt + 1;
  pSVar2->id = create_section::idcnt;
  create_section::idcnt = uVar1;
  initlist(&pSVar2->relocs);
  initlist(&pSVar2->xrefs);
  return pSVar2;
}

Assistant:

struct Section *create_section(struct ObjectUnit *ou,const char *name,
                               uint8_t *data,unsigned long size)
/* creates and initializes a Section node */
{
  static uint32_t idcnt = 0;
  struct Section *s = alloczero(sizeof(struct Section));

  if (name)
    s->name = name;
  else
    s->name = noname;
  s->data = data;
  s->size = size;
  s->obj = ou;
  s->id = idcnt++;       /* target dependant - ELF replaces this with shndx */
  initlist(&s->relocs);  /* empty relocation list */
  initlist(&s->xrefs);   /* empty xref list */
  return s;
}